

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_us * stbi_load_16_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  stbi__context s;
  stbi__context sStack_108;
  
  sStack_108.io.eof = clbk->eof;
  sStack_108.img_buffer = sStack_108.buffer_start;
  sStack_108.io.read = clbk->read;
  sStack_108.io.skip = clbk->skip;
  sStack_108.read_from_callbacks = 1;
  sStack_108.buflen = 0x80;
  sStack_108.callback_already_read = 0;
  sStack_108.io_user_data = user;
  sStack_108.img_buffer_original = sStack_108.img_buffer;
  stbi__refill_buffer(&sStack_108);
  sStack_108.img_buffer_original_end = sStack_108.img_buffer_end;
  psVar1 = stbi__load_and_postprocess_16bit(&sStack_108,x,y,channels_in_file,desired_channels);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *)clbk, user);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}